

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::ReportInvalidTestSuiteType
               (char *test_suite_name,CodeLocation *code_location)

{
  size_t sVar1;
  int line;
  pointer *__ptr;
  char *pcVar2;
  ostream *poVar3;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_68;
  GTestLog local_5c;
  string local_58;
  string local_38;
  
  Message::Message((Message *)&local_68);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_68._M_head_impl + 0x10),"Attempted redefinition of test suite ",0x25)
  ;
  poVar3 = (ostream *)(local_68._M_head_impl + 0x10);
  if (test_suite_name == (char *)0x0) {
    sVar1 = 6;
    pcVar2 = "(null)";
  }
  else {
    sVar1 = strlen(test_suite_name);
    pcVar2 = test_suite_name;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar2,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_68._M_head_impl + 0x10),".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_68._M_head_impl + 0x10),
             "All tests in the same test suite must use the same test fixture\n",0x40);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_68._M_head_impl + 0x10),"class.  However, in test suite ",0x1f);
  poVar3 = (ostream *)(local_68._M_head_impl + 0x10);
  if (test_suite_name == (char *)0x0) {
    sVar1 = 6;
    test_suite_name = "(null)";
  }
  else {
    sVar1 = strlen(test_suite_name);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,test_suite_name,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_68._M_head_impl + 0x10),", you tried\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_68._M_head_impl + 0x10),
             "to define a test using a fixture class different from the one\n",0x3e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_68._M_head_impl + 0x10),
             "used earlier. This can happen if the two fixture classes are\n",0x3d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_68._M_head_impl + 0x10),
             "from different namespaces and have the same name. You should\n",0x3d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_68._M_head_impl + 0x10),
             "probably rename one of the classes to put the tests into different\n",0x43);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_68._M_head_impl + 0x10),"test suites.",0xc);
  line = 0xaa8;
  GTestLog::GTestLog(&local_5c,GTEST_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/blt/thirdparty_builtin/googletest-master-2020-01-07/googletest/src/gtest.cc"
                     ,0xaa8);
  FormatFileLocation_abi_cxx11_
            (&local_38,(internal *)(code_location->file)._M_dataplus._M_p,
             (char *)(ulong)(uint)code_location->line,line);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_38._M_dataplus._M_p,local_38._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  StringStreamToString(&local_58,local_68._M_head_impl);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,local_58._M_dataplus._M_p,local_58._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  GTestLog::~GTestLog(&local_5c);
  if (local_68._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)local_68._M_head_impl + 8))();
  }
  return;
}

Assistant:

void ReportInvalidTestSuiteType(const char* test_suite_name,
                                CodeLocation code_location) {
  Message errors;
  errors
      << "Attempted redefinition of test suite " << test_suite_name << ".\n"
      << "All tests in the same test suite must use the same test fixture\n"
      << "class.  However, in test suite " << test_suite_name << ", you tried\n"
      << "to define a test using a fixture class different from the one\n"
      << "used earlier. This can happen if the two fixture classes are\n"
      << "from different namespaces and have the same name. You should\n"
      << "probably rename one of the classes to put the tests into different\n"
      << "test suites.";

  GTEST_LOG_(ERROR) << FormatFileLocation(code_location.file.c_str(),
                                          code_location.line)
                    << " " << errors.GetString();
}